

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O2

void score_affine(double *mat,Correspondence *points,int num_points,RANSAC_MOTION *model)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  model->num_inliers = 0;
  model->sse = 0.0;
  uVar2 = 0;
  uVar3 = (ulong)(uint)num_points;
  if (num_points < 1) {
    uVar3 = uVar2;
  }
  pdVar4 = &points->ry;
  dVar5 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar6 = (mat[2] * ((Correspondence *)(pdVar4 + -3))->x + mat[3] * pdVar4[-2] + *mat) -
            pdVar4[-1];
    dVar7 = (((Correspondence *)(pdVar4 + -3))->x * mat[4] + pdVar4[-2] * mat[5] + mat[1]) - *pdVar4
    ;
    dVar6 = dVar6 * dVar6 + dVar7 * dVar7;
    if (dVar6 < 1.5625) {
      iVar1 = model->num_inliers;
      model->num_inliers = iVar1 + 1;
      model->inlier_indices[iVar1] = (int)uVar2;
      dVar5 = dVar5 + dVar6;
      model->sse = dVar5;
    }
    pdVar4 = pdVar4 + 4;
  }
  return;
}

Assistant:

static void score_affine(const double *mat, const Correspondence *points,
                         int num_points, RANSAC_MOTION *model) {
  model->num_inliers = 0;
  model->sse = 0.0;

  for (int i = 0; i < num_points; ++i) {
    const double x1 = points[i].x;
    const double y1 = points[i].y;
    const double x2 = points[i].rx;
    const double y2 = points[i].ry;

    const double proj_x = mat[2] * x1 + mat[3] * y1 + mat[0];
    const double proj_y = mat[4] * x1 + mat[5] * y1 + mat[1];

    const double dx = proj_x - x2;
    const double dy = proj_y - y2;
    const double sse = dx * dx + dy * dy;

    if (sse < INLIER_THRESHOLD_SQUARED) {
      model->inlier_indices[model->num_inliers++] = i;
      model->sse += sse;
    }
  }
}